

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

void __thiscall HawkTracer::client::Converter::Converter(Converter *this)

{
  allocator local_11;
  
  this->_vptr_Converter = (_func_int **)&PTR__Converter_0011cbf8;
  parser::make_unique<HawkTracer::client::TracepointMap>();
  std::__cxx11::string::string
            ((string *)&this->_mapping_klass_name,"HT_StringMappingEvent",&local_11);
  this->_mapping_klass_id = 0;
  return;
}

Assistant:

Converter::Converter() :
    _tracepoint_map(HawkTracer::parser::make_unique<TracepointMap>()),
    _mapping_klass_name("HT_StringMappingEvent")
{
}